

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O2

void __thiscall
Fastzip::packZipData
          (Fastzip *this,File *f,int size,PackFormat inFormat,PackFormat outFormat,uint8_t *sha,
          ZipEntry *target)

{
  File *this_00;
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  uint32_t uVar2;
  int iVar3;
  uint8_t *out;
  size_t sVar4;
  uchar *target_00;
  int64_t iVar5;
  size_t bytes;
  ulong uVar6;
  undefined4 in_register_00000084;
  ulong __n;
  SHA_CTX local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  size_t local_80;
  uint8_t *local_78;
  Fastzip *local_70;
  undefined8 local_68;
  uint32_t *local_60;
  File *local_58;
  ulong local_50;
  ulong local_48;
  _Head_base<0UL,_unsigned_char_*,_false> local_40;
  __array outBuf;
  
  local_68 = CONCAT44(in_register_00000084,outFormat);
  local_60 = (uint32_t *)CONCAT44(local_60._4_4_,inFormat);
  uVar6 = (ulong)(uint)size;
  __n = (ulong)((size / 0x3fff) * 5 + size + 0x10005);
  local_70 = this;
  local_50 = __n;
  out = (uint8_t *)operator_new__(__n);
  memset(out,0,__n);
  target->store = false;
  local_48 = uVar6;
  local_40._M_head_impl = out;
  if (size == 0) {
    store_uncompressed(f,0,out,&local_50,&target->crc,sha);
    _Var1._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (uchar *)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
               &target->data,_Var1._M_head_impl);
    target->store = true;
    uVar6 = 0;
    goto LAB_00121980;
  }
  local_58 = f;
  if ((int)local_60 == 0) {
    sVar4 = File::tell(f);
    iVar3 = (int)local_48;
    if ((int)local_68 - 1U < 9) {
      local_78 = local_40._M_head_impl;
      bytes = (size_t)(int)local_48;
      target_00 = local_40._M_head_impl + __n + -bytes;
      local_80 = sVar4;
      local_60 = &target->crc;
      sVar4 = File::Read<unsigned_char>(f,target_00,bytes);
      if ((int)sVar4 != (int)local_48) {
LAB_001217e2:
        local_50 = __n + 7 >> 3;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"Compression failed! Storing \'",
                   (allocator<char> *)
                   ((long)&outBuf._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 7));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_140,&local_a0,&target->name);
        std::operator+(&local_e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_140,"\' as a fallback");
        this_00 = local_58;
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()(&local_70->warning,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_a0);
        File::seek(this_00,local_80,0);
        store_uncompressed(local_58,(int)local_48,local_40._M_head_impl,&local_50,local_60,sha);
        goto LAB_0012195e;
      }
      if (sha != (uint8_t *)0x0) {
        SHA1_Init(&local_140);
        SHA1_Update(&local_140,target_00,bytes);
        SHA1_Final(sha,&local_140);
      }
      uVar2 = crc32_fast(target_00,bytes,0);
      *local_60 = uVar2;
      iVar5 = iz_deflate((int)local_68,(char *)local_78,(char *)target_00,__n,bytes);
      if (iVar5 == -2) {
        local_50 = (ulong)(long)((int)local_48 << 3) >> 3;
        goto LAB_0012195e;
      }
      if (iVar5 == -1) goto LAB_001217e2;
      uVar6 = iVar5 + 7U >> 3;
    }
    else {
      store_uncompressed(f,(int)local_48,local_40._M_head_impl,&local_50,&target->crc,sha);
LAB_0012195e:
      target->store = true;
      uVar6 = local_50;
    }
    target->originalSize = (long)iVar3;
  }
  else {
    if ((int)local_68 == 10 && 0 < (int)local_60) {
      store_compressed(f,size,out,sha);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Unpacking not supported, storing \'",
                 (allocator<char> *)
                 ((long)&outBuf._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 7));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                     ,&local_a0,&target->name);
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                     ,"\' with original compression");
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()(&local_70->warning,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_a0);
      size = (int)local_48;
      iVar3 = store_compressed(f,size,local_40._M_head_impl,sha);
      target->originalSize = (long)iVar3;
    }
    uVar6 = (ulong)size;
  }
  _Var1._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (uchar *)0x0;
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)&target->data,
             _Var1._M_head_impl);
LAB_00121980:
  target->dataSize = uVar6;
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_40);
  return;
}

Assistant:

void Fastzip::packZipData(File& f, int size, PackFormat inFormat,
                          PackFormat outFormat, uint8_t* sha, ZipEntry& target)
{
    // Maximum size for deflate + space for buffer
    size_t outSize = size + (size / 16383 + 1) * 5 + 64 * 1024;
    auto outBuf = std::make_unique<uint8_t[]>(outSize);
    // auto outBuf = std::make_unique<uint8_t[]>(outSize);
    target.store = false;

    if (size == 0) {
        store_uncompressed(f, 0, outBuf.get(), &outSize, &target.crc, sha);
        target.data = std::move(outBuf);
        target.store = true;
        target.dataSize = 0;
        return;
    }

    if (inFormat == UNCOMPRESSED) {
        auto startPos = f.tell();
        PackResult state;

        if (outFormat >= ZIP1_COMPRESSED && outFormat <= ZIP9_COMPRESSED) {
            state = infozip_deflate(outFormat, f, size, outBuf.get(), &outSize,
                                    &target.crc, sha);
            outSize = (outSize + 7) >> 3;
        }
#ifdef WITH_INTEL
        else if (outFormat == INTEL_COMPRESSED)
            state = intel_deflate(f, size, outBuf.get(), &outSize, &target.crc,
                                  sha, earlyOut);
#endif
        else
            state = store_uncompressed(f, size, outBuf.get(), &outSize,
                                       &target.crc, sha);

        if (state == PackResult::FAILED) {
            warning(string("Compression failed! Storing '") + target.name +
                    "' as a fallback");
            f.seek(startPos);
            state = store_uncompressed(f, size, outBuf.get(), &outSize,
                                       &target.crc, sha);
        }
        if (state == PackResult::STORED)
            target.store = true;
        target.originalSize = size;
    } else if (inFormat > 0 && outFormat == COMPRESSED) {
        // Keep format, just inflate to calculate sha if necessary
        store_compressed(f, size, outBuf.get(), sha);
        outSize = size;
    } else {
        // Unpacking is not supported
        warning(string("Unpacking not supported, storing '") + target.name +
                "' with original compression");
        target.originalSize = store_compressed(f, size, outBuf.get(), sha);
        outSize = size;
    }

    target.data = std::move(outBuf);
    target.dataSize = outSize;
}